

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

uint8_t * xml_easy_name(xml_node *node)

{
  uint8_t *puVar1;
  
  if (node != (xml_node *)0x0) {
    puVar1 = xml_string_clone(node->name);
    return puVar1;
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* xml_easy_name(struct xml_node* node) {
	if (!node) {
		return 0;
	}

	return xml_string_clone(xml_node_name(node));
}